

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

UniValue * JSONRPCPSBTError(PSBTError err)

{
  long lVar1;
  undefined4 in_ESI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  PSBTError in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffffa8;
  PSBTError in_stack_ffffffffffffffbc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RPCErrorFromPSBTError(in_stack_ffffffffffffff68);
  common::PSBTErrorString(in_stack_ffffffffffffffbc);
  JSONRPCError(in_stack_ffffffffffffffbc,(string *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8));
  bilingual_str::~bilingual_str
            ((bilingual_str *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

UniValue JSONRPCPSBTError(PSBTError err)
{
    return JSONRPCError(RPCErrorFromPSBTError(err), PSBTErrorString(err).original);
}